

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDependentInlineMethods
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  FieldOptions *this_00;
  FieldGenerator *pFVar4;
  int local_1c;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (!bVar1) {
    for (local_1c = 0; iVar2 = Descriptor::field_count(this->descriptor_), local_1c < iVar2;
        local_1c = local_1c + 1) {
      pFVar3 = Descriptor::field(this->descriptor_,local_1c);
      this_00 = FieldDescriptor::options(pFVar3);
      bVar1 = FieldOptions::weak(this_00);
      if (bVar1) {
        pFVar3 = Descriptor::field(this->descriptor_,local_1c);
        pFVar4 = FieldGeneratorMap::get(&this->field_generators_,pFVar3);
        (*pFVar4->_vptr_FieldGenerator[6])(pFVar4,printer);
      }
    }
    GenerateDependentFieldAccessorDefinitions(this,printer);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDependentInlineMethods(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (descriptor_->field(i)->options().weak()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateDependentInlineAccessorDefinitions(printer);
    }
  }
  GenerateDependentFieldAccessorDefinitions(printer);
}